

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_forcestep(lua_State *L)

{
  global_State *g;
  undefined1 auVar1 [16];
  long lVar2;
  lu_mem lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  g = L->l_G;
  if (g->gckind == '\x02') {
    uVar4 = g->GCestimate;
    if (uVar4 == 0) {
      luaC_fullgc(L,0);
      lVar3 = g->GCdebt + g->totalbytes;
      uVar4 = lVar3;
    }
    else {
      luaC_runtilstate(L,0x20);
      g->gcstate = '\0';
      lVar3 = g->GCdebt + g->totalbytes;
      if ((long)g->gcmajorinc * (uVar4 / 100) < lVar3) {
        uVar4 = 0;
      }
    }
    g->GCestimate = uVar4;
  }
  else {
    uVar4 = 0x28;
    if (0x28 < g->gcstepmul) {
      uVar4 = (ulong)(uint)g->gcstepmul;
    }
    lVar2 = g->GCdebt / 200 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    lVar6 = lVar2 * uVar4;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / auVar1,0) <= lVar2) {
      lVar6 = 0x7ffffffffffffffc;
    }
    do {
      lVar3 = singlestep(L);
      lVar6 = lVar6 - lVar3;
      if (lVar6 < -0x95f) {
        if (g->gcstate != '\x05') {
          luaE_setdebt(g,(lVar6 / (long)uVar4) * 200);
          goto LAB_00109bf5;
        }
        break;
      }
    } while (g->gcstate != '\x05');
    lVar3 = g->GCestimate;
  }
  setpause(g,lVar3);
LAB_00109bf5:
  uVar5 = 0;
  while ((g->tobefnz != (GCObject *)0x0 && ((uVar5 < 4 || (g->gcstate == '\x05'))))) {
    GCTM(L,1);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void luaC_forcestep (lua_State *L) {
  global_State *g = G(L);
  int i;
  if (isgenerational(g)) generationalcollection(L);
  else incstep(L);
  /* run a few finalizers (or all of them at the end of a collect cycle) */
  for (i = 0; g->tobefnz && (i < GCFINALIZENUM || g->gcstate == GCSpause); i++)
    GCTM(L, 1);  /* call one finalizer */
}